

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexParser.cpp
# Opt level: O3

bool __thiscall
UnifiedRegex::Parser<UTF8EncodingPolicyBase<false>,_true>::AtSecondSingletonClassAtom
          (Parser<UTF8EncodingPolicyBase<false>,_true> *this)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  EncodedChar *pEVar4;
  byte bVar5;
  
  pEVar4 = this->next;
  if (this->inputLim < pEVar4) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                       ,0xc4,"(next + n <= inputLim)","next + n <= inputLim");
    if (!bVar2) goto LAB_00edbe9b;
    *puVar3 = 0;
    pEVar4 = this->next;
  }
  if (*pEVar4 != '-') {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                       ,0x773,"(ECLookahead() == \'-\')","ECLookahead() == \'-\'");
    if (!bVar2) goto LAB_00edbe9b;
    *puVar3 = 0;
    pEVar4 = this->next;
  }
  if (this->inputLim < pEVar4 + 1) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                       ,0xc4,"(next + n <= inputLim)","next + n <= inputLim");
    if (!bVar2) goto LAB_00edbe9b;
    *puVar3 = 0;
    pEVar4 = this->next;
  }
  bVar5 = 1;
  if (pEVar4[1] == '\\') {
    if (this->inputLim < pEVar4 + 2) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                         ,0xc4,"(next + n <= inputLim)","next + n <= inputLim");
      if (!bVar2) {
LAB_00edbe9b:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar3 = 0;
      pEVar4 = this->next;
    }
    if ((byte)(pEVar4[2] + 0xbc) < 0x34) {
      bVar5 = (byte)(0x77ffefff77ffe >> (pEVar4[2] + 0xbc & 0x3f));
    }
  }
  return (bool)(bVar5 & 1);
}

Assistant:

bool Parser<P, IsLiteral>::AtSecondSingletonClassAtom()
    {
        Assert(ECLookahead() == '-');
        if (ECLookahead(1) == '\\')
        {
            switch (ECLookahead(2))
            {
            case 'd':
            case 'D':
            case 's':
            case 'S':
            case 'w':
            case 'W':
                // These all denote non-singleton sets
                return false;
            default:
                // fall-through for singleton
                break;
            }
        }
        return true;
    }